

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ILBDOperator.cpp
# Opt level: O2

LBDOperator * lts2::CreateLbdOperator(int lbdType,int M)

{
  LBDOperator *pLVar1;
  
  if (lbdType == 1) {
    pLVar1 = CreateRandomFreakOperator(M);
    return pLVar1;
  }
  if (lbdType != 2) {
    if (lbdType == 3) {
      pLVar1 = CreateExFreakOperator(M);
      return pLVar1;
    }
    pLVar1 = CreateFreakOperator(M);
    return pLVar1;
  }
  pLVar1 = CreateBriefOperator(M);
  return pLVar1;
}

Assistant:

lts2::LBDOperator *lts2::CreateLbdOperator(int lbdType, int M)
{
  switch (lbdType)
  {
  case (int)lbd::LBD_TYPE::eTypeExFreak:
    return lts2::CreateExFreakOperator(M);
    break;

  case (int)lbd::LBD_TYPE::eTypeBrief:
    return lts2::CreateBriefOperator(M);
    break;

  case (int)lbd::LBD_TYPE::eTypeRandomFreak:
    return lts2::CreateRandomFreakOperator(M);
    break;

  case (int)lbd::LBD_TYPE::eTypeFreak:
  default:
    return lts2::CreateFreakOperator(M);
    break;
  }
}